

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.h
# Opt level: O2

cmCommand * __thiscall cmInstallProgramsCommand::Clone(cmInstallProgramsCommand *this)

{
  cmInstallProgramsCommand *this_00;
  
  this_00 = (cmInstallProgramsCommand *)operator_new(0x80);
  cmInstallProgramsCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmInstallProgramsCommand; }